

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool m68k_cpu_tlb_fill_m68k
                (CPUState *cs,vaddr address,int size,MMUAccessType qemu_access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  int iVar1;
  int iVar2;
  uint address_00;
  uint uVar3;
  target_ulong_conflict local_40;
  int local_3c;
  hwaddr local_38;
  
  address_00 = (uint)address;
  if (*(short *)(cs[1].tb_jmp_cache + 0xb8) < 0) {
    uVar3 = 0x10;
    if (qemu_access_type != MMU_INST_FETCH) {
      uVar3 = (uint)(qemu_access_type == MMU_DATA_STORE) * 2 + 0x20;
    }
    iVar1 = get_physical_address
                      ((CPUM68KState_conflict *)(cs[1].tb_jmp_cache + 0x8f),&local_38,&local_3c,
                       address_00,mmu_idx != 1 | uVar3,&local_40);
    if (iVar1 != 0) {
      if (probe) {
        return false;
      }
      iVar1 = 0x420;
      if (size != 1) {
        iVar1 = (size == 2 | 0x10) << 6;
      }
      iVar2 = iVar1 + 4;
      if (mmu_idx == 1) {
        iVar2 = iVar1;
      }
      *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) =
           (iVar2 - (uint)((uVar3 & 0x10) == 0)) + (uVar3 & 2) * 0x80 + 2 ^ 0x100;
      cs->exception_index = 2;
      *(uint *)(cs[1].tb_jmp_cache + 0xb7) = address_00;
      cpu_loop_exit_restore_m68k(cs,retaddr);
    }
    local_38 = (local_40 - 1 & address_00 & 0xfffff000) + local_38;
  }
  else {
    local_38 = (hwaddr)(address_00 & 0xfffff000);
    local_3c = 7;
  }
  tlb_set_page_m68k(cs,address_00 & 0xfffff000,local_38,local_3c,mmu_idx,0x1000);
  return true;
}

Assistant:

bool m68k_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType qemu_access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;

    hwaddr physical;
    int prot;
    int access_type;
    int ret;
    target_ulong page_size;

    if ((env->mmu.tcr & M68K_TCR_ENABLED) == 0) {
        /* MMU disabled */
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     address & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

    if (qemu_access_type == MMU_INST_FETCH) {
        access_type = ACCESS_CODE;
    } else {
        access_type = ACCESS_DATA;
        if (qemu_access_type == MMU_DATA_STORE) {
            access_type |= ACCESS_STORE;
        }
    }
    if (mmu_idx != MMU_USER_IDX) {
        access_type |= ACCESS_SUPER;
    }

    ret = get_physical_address(&cpu->env, &physical, &prot,
                               address, access_type, &page_size);
    if (likely(ret == 0)) {
        address &= TARGET_PAGE_MASK;
        physical += address & (page_size - 1);
        tlb_set_page(cs, address, physical,
                     prot, mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

    if (probe) {
        return false;
    }

    /* page fault */
    env->mmu.ssw = M68K_ATC_040;
    switch (size) {
    case 1:
        env->mmu.ssw |= M68K_BA_SIZE_BYTE;
        break;
    case 2:
        env->mmu.ssw |= M68K_BA_SIZE_WORD;
        break;
    case 4:
        env->mmu.ssw |= M68K_BA_SIZE_LONG;
        break;
    }
    if (access_type & ACCESS_SUPER) {
        env->mmu.ssw |= M68K_TM_040_SUPER;
    }
    if (access_type & ACCESS_CODE) {
        env->mmu.ssw |= M68K_TM_040_CODE;
    } else {
        env->mmu.ssw |= M68K_TM_040_DATA;
    }
    if (!(access_type & ACCESS_STORE)) {
        env->mmu.ssw |= M68K_RW_040;
    }

    cs->exception_index = EXCP_ACCESS;
    env->mmu.ar = address;
    cpu_loop_exit_restore(cs, retaddr);
}